

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::OP_SetHomeObj(Var method,Var homeObj)

{
  bool bVar1;
  ThreadContext *pTVar2;
  ScriptFunctionBase *pSVar3;
  
  pSVar3 = VarTo<Js::ScriptFunctionBase>(method);
  pTVar2 = ((((((pSVar3->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.
               ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
           threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  (*(pSVar3->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])
            (pSVar3,homeObj);
  pTVar2->noJsReentrancy = bVar1;
  return;
}

Assistant:

void JavascriptOperators::OP_SetHomeObj(Var method, Var homeObj)
    {
        ScriptFunctionBase *scriptFunction = VarTo<ScriptFunctionBase>(method);
        JIT_HELPER_NOT_REENTRANT_HEADER(SetHomeObj, reentrancylock, scriptFunction->GetScriptContext()->GetThreadContext());
        scriptFunction->SetHomeObj(homeObj);
        JIT_HELPER_END(SetHomeObj);
    }